

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::anon_unknown_1::readInt(IVec4 *dst,VertexAttribType type,int size,void *ptr)

{
  void *ptr_local;
  int size_local;
  VertexAttribType type_local;
  IVec4 *dst_local;
  
  switch(type) {
  case VERTEXATTRIBTYPE_FLOAT:
  case VERTEXATTRIBTYPE_HALF:
  case VERTEXATTRIBTYPE_FIXED:
  case VERTEXATTRIBTYPE_DOUBLE:
  case VERTEXATTRIBTYPE_NONPURE_UNORM8:
  case VERTEXATTRIBTYPE_NONPURE_UNORM16:
  case VERTEXATTRIBTYPE_NONPURE_UNORM32:
  case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV:
  case VERTEXATTRIBTYPE_NONPURE_SNORM8_CLAMP:
  case VERTEXATTRIBTYPE_NONPURE_SNORM16_CLAMP:
  case VERTEXATTRIBTYPE_NONPURE_SNORM32_CLAMP:
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP:
  case VERTEXATTRIBTYPE_NONPURE_SNORM8_SCALE:
  case VERTEXATTRIBTYPE_NONPURE_SNORM16_SCALE:
  case VERTEXATTRIBTYPE_NONPURE_SNORM32_SCALE:
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE:
  case VERTEXATTRIBTYPE_NONPURE_UINT8:
  case VERTEXATTRIBTYPE_NONPURE_UINT16:
  case VERTEXATTRIBTYPE_NONPURE_UINT32:
  case VERTEXATTRIBTYPE_NONPURE_INT8:
  case VERTEXATTRIBTYPE_NONPURE_INT16:
  case VERTEXATTRIBTYPE_NONPURE_INT32:
  case VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV:
  case VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV:
  case VERTEXATTRIBTYPE_PURE_UINT8:
  case VERTEXATTRIBTYPE_PURE_UINT16:
  case VERTEXATTRIBTYPE_PURE_UINT32:
  case VERTEXATTRIBTYPE_NONPURE_UNORM8_BGRA:
  case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA:
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA:
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA:
    break;
  case VERTEXATTRIBTYPE_PURE_INT8:
    rr::(anonymous_namespace)::read<signed_char,int>(dst,size,ptr);
    break;
  case VERTEXATTRIBTYPE_PURE_INT16:
    rr::(anonymous_namespace)::read<short,int>(dst,size,ptr);
    break;
  case VERTEXATTRIBTYPE_PURE_INT32:
    rr::(anonymous_namespace)::read<int,int>(dst,size,ptr);
  }
  return;
}

Assistant:

void readInt (tcu::IVec4& dst, const VertexAttribType type, const int size, const void* ptr)
{
	switch (type)
	{
		case VERTEXATTRIBTYPE_PURE_INT8:				read<deInt8>		(dst, size, ptr);	break;
		case VERTEXATTRIBTYPE_PURE_INT16:				read<deInt16>		(dst, size, ptr);	break;
		case VERTEXATTRIBTYPE_PURE_INT32:				read<deInt32>		(dst, size, ptr);	break;

		case VERTEXATTRIBTYPE_FLOAT:
		case VERTEXATTRIBTYPE_HALF:
		case VERTEXATTRIBTYPE_FIXED:
		case VERTEXATTRIBTYPE_DOUBLE:
		case VERTEXATTRIBTYPE_NONPURE_UNORM8:
		case VERTEXATTRIBTYPE_NONPURE_UNORM16:
		case VERTEXATTRIBTYPE_NONPURE_UNORM32:
		case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV:
		case VERTEXATTRIBTYPE_NONPURE_SNORM8_CLAMP:
		case VERTEXATTRIBTYPE_NONPURE_SNORM16_CLAMP:
		case VERTEXATTRIBTYPE_NONPURE_SNORM32_CLAMP:
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP:
		case VERTEXATTRIBTYPE_NONPURE_SNORM8_SCALE:
		case VERTEXATTRIBTYPE_NONPURE_SNORM16_SCALE:
		case VERTEXATTRIBTYPE_NONPURE_SNORM32_SCALE:
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE:
		case VERTEXATTRIBTYPE_NONPURE_UINT8:
		case VERTEXATTRIBTYPE_NONPURE_UINT16:
		case VERTEXATTRIBTYPE_NONPURE_UINT32:
		case VERTEXATTRIBTYPE_NONPURE_INT8:
		case VERTEXATTRIBTYPE_NONPURE_INT16:
		case VERTEXATTRIBTYPE_NONPURE_INT32:
		case VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV:
		case VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV:
		case VERTEXATTRIBTYPE_PURE_UINT8:
		case VERTEXATTRIBTYPE_PURE_UINT16:
		case VERTEXATTRIBTYPE_PURE_UINT32:
		case VERTEXATTRIBTYPE_NONPURE_UNORM8_BGRA:
		case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA:
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA:
		case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA:
			DE_FATAL("Invalid read");

		default:
			DE_ASSERT(false);
	}
}